

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

uint64_t helper_cvd(int32_t reg)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)((uint)reg >> 0x1f) | 0xc;
  uVar1 = (ulong)(uint)-reg;
  if (0 < reg) {
    uVar1 = (ulong)(uint)reg;
  }
  uVar2 = 4;
  for (; (uVar2 < 0x40 && (uVar1 != 0)); uVar1 = uVar1 / 10) {
    uVar3 = uVar3 | uVar1 % 10 << ((byte)uVar2 & 0x3f);
    uVar2 = uVar2 + 4;
  }
  return uVar3;
}

Assistant:

uint64_t HELPER(cvd)(int32_t reg)
{
    /* positive 0 */
    uint64_t dec = 0x0c;
    int64_t bin = reg;
    int shift;

    if (bin < 0) {
        bin = -bin;
        dec = 0x0d;
    }

    for (shift = 4; (shift < 64) && bin; shift += 4) {
        dec |= (bin % 10) << shift;
        bin /= 10;
    }

    return dec;
}